

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sl_serial.c
# Opt level: O0

slReturn autoBaudRate(int fdPort,int minBaud,baudRateSynchronizer *synchronizer,int verbosity)

{
  bool bVar1;
  errInfo error;
  errInfo error_00;
  _Bool _Var2;
  longlong lVar3;
  void *pvVar4;
  slReturn pvVar5;
  errorInfo_slReturn local_130;
  errorInfo_slReturn local_110;
  slReturn local_f0;
  slReturn syncResp;
  slReturn local_c8;
  slReturn stobResp;
  uint local_b8;
  int i;
  int bauds [20];
  undefined1 auStack_58 [4];
  int maxMs;
  char *local_50;
  char *local_48;
  uint32_t local_40;
  undefined4 uStack_3c;
  slReturn local_38;
  slReturn gsiResp;
  speedInfo si;
  int verbosity_local;
  baudRateSynchronizer *synchronizer_local;
  int minBaud_local;
  int fdPort_local;
  
  si.nsBit = verbosity;
  unique0x10000509 = synchronizer;
  local_38 = getSpeedInfo(fdPort,(speedInfo *)&gsiResp);
  _Var2 = isErrorReturn(local_38);
  if (_Var2) {
    createErrorInfo((errorInfo_slReturn *)auStack_58,
                    "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                    ,"autoBaudRate",0x12d,local_38);
    error.fileName = local_50;
    error.cause = _auStack_58;
    error.functionName = local_48;
    error.lineNumber = local_40;
    error._28_4_ = uStack_3c;
    _minBaud_local = makeErrorMsgReturn(error,"problem getting speed information");
  }
  else {
    lVar3 = max_ll(4000,(long)((si.baudRate * 0xfa) / 1000000));
    memcpy(&local_b8,&DAT_0011e7b0,0x50);
    if (2 < si.nsBit) {
      printf("Trying baud rates from 921600 to %d...\n",(ulong)(uint)minBaud);
    }
    stobResp._4_4_ = 0;
    while( true ) {
      bVar1 = false;
      if (stobResp._4_4_ < 0x14) {
        bVar1 = minBaud <= (int)(&local_b8)[(int)stobResp._4_4_];
      }
      if (!bVar1) {
        printf("Could not synchronize on any baud rate...\n");
        createErrorInfo(&local_130,
                        "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                        ,"autoBaudRate",0x148,(slReturn)0x0);
        pvVar5 = makeErrorFmtMsgReturn(0x11ec3d,(char *)(ulong)(uint)minBaud);
        return pvVar5;
      }
      if (1 < si.nsBit) {
        printf("Trying %d baud...\n",(ulong)(&local_b8)[(int)stobResp._4_4_]);
      }
      local_c8 = setTermOptionsBaud(fdPort,(&local_b8)[(int)stobResp._4_4_]);
      _Var2 = isErrorReturn(local_c8);
      if (_Var2) {
        createErrorInfo((errorInfo_slReturn *)&syncResp,
                        "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                        ,"autoBaudRate",0x13c,local_c8);
        pvVar5 = makeErrorFmtMsgReturn(0x11ebb4,(char *)(ulong)(&local_b8)[(int)stobResp._4_4_]);
        return pvVar5;
      }
      local_f0 = (*stack0xffffffffffffffe0)(fdPort,(int)lVar3,si.nsBit);
      _Var2 = isErrorReturn(local_f0);
      if (_Var2) {
        createErrorInfo(&local_110,
                        "/workspace/llm4binary/github/license_c_cmakelists/philrandal[P]gpsctl/sl_serial.c"
                        ,"autoBaudRate",0x141,local_f0);
        error_00.fileName = local_110.fileName;
        error_00.cause = local_110.cause;
        error_00.functionName = local_110.functionName;
        error_00.lineNumber = local_110.lineNumber;
        error_00._28_4_ = local_110._28_4_;
        pvVar5 = makeErrorMsgReturn(error_00,"problem while synchronizing");
        return pvVar5;
      }
      pvVar4 = getReturnInfo(local_f0);
      if (pvVar4 != (void *)0x0) break;
      stobResp._4_4_ = stobResp._4_4_ + 1;
    }
    if (1 < si.nsBit) {
      printf("Synchronized on %d baud...\n",(ulong)(&local_b8)[(int)stobResp._4_4_]);
    }
    _minBaud_local = makeOkInfoReturn((void *)(long)(int)(&local_b8)[(int)stobResp._4_4_]);
  }
  return _minBaud_local;
}

Assistant:

extern slReturn autoBaudRate( int fdPort, int minBaud, baudRateSynchronizer synchronizer, int verbosity ) {

    // we're going to allow 250 character times, or 4 seconds, whichever is greater...
    speedInfo si;
    // this code block is in the wrong place, IMHO, and should be in the loop below
    // However, a timeout of 4 seconds is OK for our purposes here, so I'm leaving it - PR
    slReturn gsiResp = getSpeedInfo( fdPort, &si );
    if( isErrorReturn( gsiResp ) )
        return makeErrorMsgReturn( ERR_CAUSE( gsiResp ), "problem getting speed information" );
    int maxMs = (int) max_ll( 4000, si.nsChar * 250 / 1000000 );

    int bauds[] = { 921600, 460800, 230400, 115200, 57600, 38400, 19200, 9600, 4800, 2400,
                    1800, 1200, 600, 300, 200, 150, 134, 110, 75, 50   };

    if( verbosity >= 3 ) printf( "Trying baud rates from 921600 to %d...\n", minBaud );

    for( int i = 0; (i < ARRAY_SIZE( bauds ) ) && (bauds[i] >= minBaud); i++ ) {

        if( verbosity >= 2 ) printf( "Trying %d baud...\n", bauds[i] );

        // set the baud rate for the current attempt...
        slReturn stobResp = setTermOptionsBaud( fdPort, bauds[i] );
        if( isErrorReturn( stobResp ) )
            return makeErrorFmtMsgReturn( ERR_CAUSE( stobResp ), "problem trying to set baud rate to %d", bauds[i] );

        // try to synchronize on it...
        slReturn syncResp = synchronizer( fdPort, maxMs, verbosity );
        if( isErrorReturn( syncResp ) )
            return makeErrorMsgReturn( ERR_CAUSE( syncResp ), "problem while synchronizing" );
        if( getReturnInfoBool( syncResp ) ) {
            if( verbosity >= 2 ) printf( "Synchronized on %d baud...\n", bauds[i] );
            return makeOkInfoReturn(int2info( bauds[i] ));
        }
    }
    printf( "Could not synchronize on any baud rate...\n" );
    return makeErrorFmtMsgReturn( ERR_ROOT, "could not synchronize at any baud rate from 921600 to %d", minBaud );
}